

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>>::Visitor,0ul,1ul,2ul,3ul>
               (FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_> *message,int tag,Visitor *visitor)

{
  size_t sStack_20;
  
  if (tag == 0x11) {
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>>
    ::Visitor::operator()(visitor,(FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_> *)(message + 1))
    ;
    sStack_20 = 1;
  }
  else if (tag == 0x1d) {
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>>
    ::Visitor::operator()(visitor,(FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_> *)(message + 3));
    sStack_20 = 3;
  }
  else if (tag == 0x1f) {
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>>
    ::Visitor::operator()(visitor,(FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_> *)(message + 2));
    sStack_20 = 2;
  }
  else {
    if (tag != 0x20) {
      return false;
    }
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<124u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<32u,Fixpp::Type::Float>,Fixpp::TagT<17u,Fixpp::Type::String>,Fixpp::TagT<31u,Fixpp::Type::Float>,Fixpp::TagT<29u,Fixpp::Type::Char>>>>
    ::Visitor::operator()(visitor,message);
    sStack_20 = 0;
  }
  std::bitset<4UL>::set((bitset<4UL> *)&message[4].m_view.second,sStack_20,true);
  return true;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }